

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
          *this,int opcode)

{
  Kind KVar1;
  int iVar2;
  NumericExpr *__return_storage_ptr___00;
  int iVar3;
  LogicalExpr condition;
  string local_1a0 [32];
  NumericExpr else_expr;
  NumericExpr then_expr;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  Expr local_a0;
  NumericExpr local_80;
  Reference local_60;
  NumericExpr local_40;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr_abi_cxx11_(&condition,this);
    ReadNumericExpr_abi_cxx11_(&then_expr,this,false);
    ReadNumericExpr_abi_cxx11_(&else_expr,this,false);
    std::__cxx11::string::string(local_120,(string *)&condition);
    std::__cxx11::string::string(local_140,(string *)&then_expr);
    std::__cxx11::string::string(local_e0,(string *)&else_expr);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string((string *)&else_expr);
    std::__cxx11::string::~string((string *)&then_expr);
    __return_storage_ptr___00 = &condition;
    goto LAB_0011e801;
  case PLTERM:
    iVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                      (*(BinaryReader<mp::internal::IdentityConverter> **)this);
    if (iVar2 < 2) {
      BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x12cf1b);
    }
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    while( true ) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
      ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                      *)this);
      if (iVar3 + -1 == 0) break;
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
      ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                      *)this);
      iVar3 = iVar3 + -1;
    }
    __return_storage_ptr___00 = &local_60;
    ReadReference_abi_cxx11_(__return_storage_ptr___00,this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_0011e685_caseD_29:
    BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x12cf43);
    goto LAB_0011e891;
  case FIRST_ITERATED:
    iVar2 = 1;
    goto LAB_0011e77f;
  case SUM:
    iVar2 = 3;
LAB_0011e77f:
    iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,iVar2);
LAB_0011e88c:
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar2,(ArgHandler *)&condition);
LAB_0011e891:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  case LAST_ITERATED:
    iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    ReadNumericExpr_abi_cxx11_(&local_80,this,false);
    std::__cxx11::string::~string((string *)&local_80);
    iVar2 = iVar2 + -1;
    goto LAB_0011e88c;
  case NUMBEROF_SYM:
    iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    ReadSymbolicExpr_abi_cxx11_(&local_a0,this);
    std::__cxx11::string::~string((string *)&local_a0);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar2 + -1,(ArgHandler *)&condition);
    goto LAB_0011e891;
  case COUNT:
    ReadCountExpr_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    if (KVar1 == ADD) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
      ::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
                         *)&condition,
                        (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                         *)this);
      std::__cxx11::string::string(local_100,(string *)&condition);
      std::__cxx11::string::string(local_c0,local_1a0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_100);
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
      ::
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
      ::~BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
                          *)&condition);
      return __return_storage_ptr__;
    }
    if (KVar1 != FIRST_UNARY) goto switchD_0011e685_caseD_29;
    __return_storage_ptr___00 = &local_40;
    ReadNumericExpr_abi_cxx11_(__return_storage_ptr___00,this,false);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0011e801:
  std::__cxx11::string::~string((string *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}